

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::GetActualResultType
          (ValidationState_t *_,Instruction *inst,uint32_t *actual_result_type)

{
  ushort uVar1;
  pointer puVar2;
  bool bVar3;
  uint uVar4;
  Instruction *pIVar5;
  long lVar6;
  char *pcVar7;
  DiagnosticStream DStack_1f8;
  
  uVar1 = (inst->inst_).opcode;
  if ((uVar1 - 0x131 < 0xc) || (uVar1 == 0x140)) {
    pIVar5 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if (pIVar5 == (Instruction *)0x0) {
      __assert_fail("type_inst",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_image.cpp"
                    ,0x2e9,
                    "spv_result_t spvtools::val::(anonymous namespace)::GetActualResultType(ValidationState_t &, const Instruction *, uint32_t *)"
                   );
    }
    if ((pIVar5->inst_).opcode == 0x1e) {
      puVar2 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((long)(pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 == 0x10) {
        bVar3 = ValidationState_t::IsIntScalarType(_,puVar2[2]);
        if (bVar3) {
          uVar4 = (pIVar5->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start[3];
          goto LAB_00674892;
        }
      }
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar7 = "Expected Result Type to be a struct containing an int scalar and a texel";
      lVar6 = 0x48;
    }
    else {
      ValidationState_t::diag(&DStack_1f8,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar7 = "Expected Result Type to be OpTypeStruct";
      lVar6 = 0x27;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1f8,pcVar7,lVar6);
    DiagnosticStream::~DiagnosticStream(&DStack_1f8);
  }
  else {
    uVar4 = (inst->inst_).type_id;
LAB_00674892:
    *actual_result_type = uVar4;
    DStack_1f8.error_ = SPV_SUCCESS;
  }
  return DStack_1f8.error_;
}

Assistant:

spv_result_t GetActualResultType(ValidationState_t& _, const Instruction* inst,
                                 uint32_t* actual_result_type) {
  const spv::Op opcode = inst->opcode();

  if (IsSparse(opcode)) {
    const Instruction* const type_inst = _.FindDef(inst->type_id());
    assert(type_inst);

    if (!type_inst || type_inst->opcode() != spv::Op::OpTypeStruct) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be OpTypeStruct";
    }

    if (type_inst->words().size() != 4 ||
        !_.IsIntScalarType(type_inst->word(2))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Result Type to be a struct containing an int "
                "scalar and a texel";
    }

    *actual_result_type = type_inst->word(3);
  } else {
    *actual_result_type = inst->type_id();
  }

  return SPV_SUCCESS;
}